

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::anon_unknown_7::SetMessageVariables
               (FieldDescriptor *descriptor,Options *options,bool implicit_weak,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  mapped_type *pmVar4;
  long *plVar5;
  Descriptor *pDVar6;
  undefined8 *puVar7;
  Options *pOVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_190;
  key_type local_170;
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  Options *local_110;
  long local_108;
  _Alloc_hider local_100;
  size_type sStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  char local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  char local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  key_type local_50;
  
  pOVar8 = (Options *)variables;
  SetCommonFieldVariables(descriptor,variables,options);
  FieldMessageTypeName_abi_cxx11_(&local_190,(cpp *)descriptor,(FieldDescriptor *)options,pOVar8);
  paVar1 = &local_170.field_2;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_170);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  paVar2 = &local_190.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_d0._M_allocated_capacity = (size_type)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_d0);
  local_130._M_allocated_capacity = (size_type)&local_120;
  pcVar3 = (pmVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,pcVar3 + pmVar4->_M_string_length);
  std::__cxx11::string::append(local_130._M_local_buf);
  local_f0._M_allocated_capacity = (size_type)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_f0);
  pOVar8 = (Options *)(local_150 + 0x10);
  pcVar3 = (pmVar4->_M_dataplus)._M_p;
  local_150._0_8_ = pOVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,pcVar3,pcVar3 + pmVar4->_M_string_length);
  std::__cxx11::string::append(local_150);
  if (implicit_weak) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   "reinterpret_cast< ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
    plVar5 = (long *)std::__cxx11::string::append(local_b0._M_local_buf);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_170.field_2._M_allocated_capacity = *psVar9;
      local_170.field_2._8_8_ = plVar5[3];
      local_170._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar9;
      local_170._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_170._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_170,local_150._0_8_);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_190.field_2._M_allocated_capacity = *psVar9;
      local_190.field_2._8_8_ = plVar5[3];
      local_190._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar9;
      local_190._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_190._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
    local_110 = (Options *)&local_100;
    pOVar8 = (Options *)(plVar5 + 2);
    if ((Options *)*plVar5 == pOVar8) {
      local_100._M_p = (pOVar8->dllexport_decl)._M_dataplus._M_p;
      sStack_f8 = plVar5[3];
    }
    else {
      local_100._M_p = (pOVar8->dllexport_decl)._M_dataplus._M_p;
      local_110 = (Options *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)pOVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity);
    }
  }
  else {
    local_110 = (Options *)&local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_150._0_8_,(pointer)(local_150._0_8_ + local_150._8_8_));
  }
  local_190._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"casted_member","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_190);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_110 != (Options *)&local_100) {
    operator_delete(local_110);
  }
  if ((Options *)local_150._0_8_ != (Options *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((char *)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_allocated_capacity != &local_120) {
    operator_delete((void *)local_130._M_allocated_capacity);
  }
  if ((char *)local_d0._M_allocated_capacity != local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity);
  }
  pDVar6 = FieldDescriptor::message_type(descriptor);
  QualifiedDefaultInstanceName_abi_cxx11_(&local_190,(cpp *)pDVar6,(Descriptor *)options,pOVar8);
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"type_default_instance","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_170);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  pDVar6 = FieldDescriptor::message_type(descriptor);
  QualifiedDefaultInstancePtr_abi_cxx11_(&local_190,(cpp *)pDVar6,(Descriptor *)options,pOVar8);
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"type_default_instance_ptr","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_170);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (implicit_weak) {
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"proto_ns","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   "  ::",pmVar4);
    plVar5 = (long *)std::__cxx11::string::append(local_d0._M_local_buf);
    local_130._M_allocated_capacity = (size_type)&local_120;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar10) {
      local_120._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_120._8_4_ = (undefined4)plVar5[3];
      local_120._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    }
    else {
      local_120._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_130._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar5;
    }
    local_130._8_8_ = plVar5[1];
    *plVar5 = (long)paVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_f0._M_allocated_capacity = (size_type)local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_f0);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (local_130._M_local_buf,(ulong)(pmVar4->_M_dataplus)._M_p);
    local_110 = (Options *)&local_100;
    pOVar8 = (Options *)(plVar5 + 2);
    if ((Options *)*plVar5 == pOVar8) {
      local_100._M_p = (pOVar8->dllexport_decl)._M_dataplus._M_p;
      sStack_f8 = plVar5[3];
    }
    else {
      local_100._M_p = (pOVar8->dllexport_decl)._M_dataplus._M_p;
      local_110 = (Options *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)pOVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar10) {
      local_a0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_a0._8_4_ = (undefined4)plVar5[3];
      local_a0._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    }
    else {
      local_a0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_b0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar5;
    }
    local_b0._8_8_ = plVar5[1];
    *plVar5 = (long)paVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_60 + 0x10),"type_default_instance","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)(local_60 + 0x10));
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_b0._M_local_buf,(ulong)(pmVar4->_M_dataplus)._M_p);
    psVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_170.field_2._M_allocated_capacity = *psVar9;
      local_170.field_2._8_8_ = puVar7[3];
      local_170._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar9;
      local_170._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_170._M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
    psVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_190.field_2._M_allocated_capacity = *psVar9;
      local_190.field_2._8_8_ = puVar7[3];
      local_190._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar9;
      local_190._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_190._M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
  }
  else {
    local_190._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  }
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"type_reference_function","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_90);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_190);
  if ((undefined1 *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (implicit_weak) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity);
    }
    if (local_110 != (Options *)&local_100) {
      operator_delete(local_110);
    }
    if ((char *)local_f0._0_8_ != local_e0) {
      operator_delete((void *)local_f0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_allocated_capacity != &local_120) {
      operator_delete((void *)local_130._M_allocated_capacity);
    }
    if ((char *)local_d0._M_allocated_capacity != local_c0) {
      operator_delete((void *)local_d0._M_allocated_capacity);
    }
    if ((Options *)local_150._0_8_ != (Options *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_);
    }
  }
  pDVar6 = *(Descriptor **)(descriptor + 0x20);
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"release_","");
  SafeFunctionName(&local_190,pDVar6,descriptor,(string *)&local_90);
  local_70._M_allocated_capacity = (size_type)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"release_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_70);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_190);
  if ((undefined1 *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((undefined1 *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  local_190._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"full_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_190);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor,
                         const Options& options, bool implicit_weak,
                         std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["type"] = FieldMessageTypeName(descriptor, options);
  (*variables)["casted_member"] = ReinterpretCast(
      (*variables)["type"] + "*", (*variables)["name"] + "_", implicit_weak);
  (*variables)["type_default_instance"] =
      QualifiedDefaultInstanceName(descriptor->message_type(), options);
  (*variables)["type_default_instance_ptr"] =
      QualifiedDefaultInstancePtr(descriptor->message_type(), options);
  (*variables)["type_reference_function"] =
      implicit_weak ? ("  ::" + (*variables)["proto_ns"] +
                       "::internal::StrongReference(reinterpret_cast<const " +
                       (*variables)["type"] + "&>(\n" +
                       (*variables)["type_default_instance"] + "));\n")
                    : "";
  // NOTE: Escaped here to unblock proto1->proto2 migration.
  // TODO(liujisi): Extend this to apply for other conflicting methods.
  (*variables)["release_name"] =
      SafeFunctionName(descriptor->containing_type(), descriptor, "release_");
  (*variables)["full_name"] = descriptor->full_name();
}